

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O0

void print_bittiming(calc_data *data)

{
  undefined8 *in_RDI;
  uint sample_point;
  _Bool verbose;
  _Bool quiet;
  uint *bitrates;
  _func_void_can_bittiming_ptr__Bool *printf_btr;
  calc_ref_clk *ref_clks;
  calc_ref_clk *in_stack_00000050;
  can_bittiming *in_stack_00000058;
  can_bittiming_const *in_stack_00000060;
  alg *in_stack_00000068;
  _func_void_can_bittiming_ptr__Bool *in_stack_00000080;
  __u32 *local_28;
  int *local_18;
  
  local_18 = (int *)in_RDI[4];
  if ((*local_18 == 0) && ((*(byte *)(in_RDI + 0xb) & 1) == 0)) {
    printf("Skipping bit timing parameter calculation for %s, no ref clock defined\n\n",*in_RDI);
  }
  for (; *local_18 != 0; local_18 = local_18 + 4) {
    local_28 = (__u32 *)in_RDI[5];
    while( true ) {
      if (*local_28 == 0) break;
      if (*(int *)(in_RDI + 6) == 0) {
        get_cia_sample_point(*local_28);
      }
      print_bittiming_one(in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                          data._4_4_,(uint)data,in_stack_00000080,ref_clks._7_1_,ref_clks._6_1_,
                          ref_clks._5_1_);
      local_28 = local_28 + 1;
    }
    printf("\n");
  }
  return;
}

Assistant:

static void print_bittiming(const struct calc_data *data)
{
	const struct calc_ref_clk *ref_clks = data->ref_clks;

	if (!ref_clks->clk && !data->quiet)
		printf("Skipping bit timing parameter calculation for %s, no ref clock defined\n\n",
		       data->bittiming_const->name);

	while (ref_clks->clk) {
		void (*printf_btr)(struct can_bittiming *bt, bool hdr);
		unsigned int const *bitrates = data->bitrates;
		bool quiet = data->quiet;
		bool verbose = data->verbose;

		if (data->printf_btr)
			printf_btr = data->printf_btr;
		else
			printf_btr = printf_btr_nop;

		while (*bitrates) {
			unsigned int sample_point;

			/* get nominal sample point */
			if (data->sample_point)
				sample_point = data->sample_point;
			else
				sample_point = get_cia_sample_point(*bitrates);

			print_bittiming_one(data->alg,
					    data->bittiming_const,
					    data->opt_bt,
					    ref_clks,
					    *bitrates,
					    sample_point,
					    printf_btr,
					    quiet,
					    verbose,
					    data->fd_mode);
			bitrates++;
			quiet = true;
		}

		printf("\n");
		ref_clks++;
	}
}